

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_253962::WaveBackend::~WaveBackend(WaveBackend *this)

{
  WaveBackend *in_RDI;
  
  ~WaveBackend(in_RDI);
  (anonymous_namespace)::WaveBackend::operator_delete((void *)0x24a7e2);
  return;
}

Assistant:

WaveBackend::~WaveBackend()
{
    if(mFile)
        fclose(mFile);
    mFile = nullptr;
}